

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_pubnonce_load
              (secp256k1_context *ctx,secp256k1_ge *ges,secp256k1_musig_pubnonce *nonce)

{
  uchar uVar1;
  uchar uVar2;
  long lVar3;
  bool bVar4;
  secp256k1_ge_storage local_58;
  
  lVar3 = 0;
  do {
    uVar1 = nonce->data[lVar3];
    uVar2 = secp256k1_musig_pubnonce_magic[lVar3];
    if (uVar1 != uVar2) break;
    bVar4 = lVar3 != 3;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  if (uVar1 != uVar2) {
    secp256k1_musig_pubnonce_load_cold_1();
  }
  else {
    local_58.x.n[0] = *(uint64_t *)(nonce->data + 4);
    local_58.x.n[1] = *(uint64_t *)(nonce->data + 0xc);
    local_58.x.n[2] = *(uint64_t *)(nonce->data + 0x14);
    local_58.x.n[3] = *(uint64_t *)(nonce->data + 0x1c);
    local_58.y.n[0] = *(uint64_t *)(nonce->data + 0x24);
    local_58.y.n[1] = *(uint64_t *)(nonce->data + 0x2c);
    local_58.y.n[2] = *(uint64_t *)(nonce->data + 0x34);
    local_58.y.n[3] = *(uint64_t *)(nonce->data + 0x3c);
    secp256k1_ge_from_storage(ges,&local_58);
    local_58.x.n[0] = *(uint64_t *)(nonce->data + 0x44);
    local_58.x.n[1] = *(uint64_t *)(nonce->data + 0x4c);
    local_58.x.n[2] = *(uint64_t *)(nonce->data + 0x54);
    local_58.x.n[3] = *(uint64_t *)(nonce->data + 0x5c);
    local_58.y.n[0] = *(uint64_t *)(nonce->data + 100);
    local_58.y.n[1] = *(uint64_t *)(nonce->data + 0x6c);
    local_58.y.n[2] = *(uint64_t *)(nonce->data + 0x74);
    local_58.y.n[3] = *(uint64_t *)(nonce->data + 0x7c);
    secp256k1_ge_from_storage(ges + 1,&local_58);
  }
  return (uint)(uVar1 == uVar2);
}

Assistant:

static int secp256k1_musig_pubnonce_load(const secp256k1_context* ctx, secp256k1_ge* ges, const secp256k1_musig_pubnonce* nonce) {
    int i;

    ARG_CHECK(secp256k1_memcmp_var(&nonce->data[0], secp256k1_musig_pubnonce_magic, 4) == 0);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_from_bytes(&ges[i], nonce->data + 4 + 64*i);
    }
    return 1;
}